

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  byte *pbVar6;
  char cVar7;
  int iVar8;
  
  iVar3 = 0;
  cVar7 = '\0';
  iVar8 = 1;
switchD_00630b8b_caseD_4:
  while( true ) {
    iVar5 = iVar8;
    pbVar6 = (byte *)ptr;
    pbVar1 = pbVar6 + 2;
    bVar2 = pbVar6[3];
    ptr = (char *)pbVar1;
    iVar8 = iVar5;
    if (bVar2 == 0) break;
    if (bVar2 - 0xd8 < 4) {
switchD_00630b8b_caseD_7:
      if ((iVar5 == 0) && (iVar5 = 1, iVar3 < attsMax)) {
        atts[iVar3].name = (char *)pbVar1;
        atts[iVar3].normalized = '\x01';
      }
      ptr = (char *)(pbVar6 + 4);
      iVar8 = iVar5;
    }
    else if (3 < bVar2 - 0xdc) {
      if (bVar2 != 0xff) goto switchD_00630b8b_caseD_5;
      if (*pbVar1 < 0xfe && iVar5 == 0) {
LAB_00630b9c:
        iVar8 = 1;
        if (iVar3 < attsMax) {
          atts[iVar3].name = (char *)pbVar1;
          atts[iVar3].normalized = '\x01';
        }
      }
    }
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar1)) {
  case 3:
    if (iVar3 < attsMax) {
      atts[iVar3].normalized = '\0';
    }
  default:
    goto switchD_00630b8b_caseD_4;
  case 5:
  case 0x16:
  case 0x18:
  case 0x1d:
switchD_00630b8b_caseD_5:
    if (iVar5 == 0) goto LAB_00630b9c;
    goto switchD_00630b8b_caseD_4;
  case 6:
    ptr = (char *)(pbVar6 + 3);
    if ((iVar5 == 0) && (iVar8 = 1, iVar3 < attsMax)) {
      atts[iVar3].name = (char *)pbVar1;
      atts[iVar3].normalized = '\x01';
    }
    goto switchD_00630b8b_caseD_4;
  case 7:
    goto switchD_00630b8b_caseD_7;
  case 9:
  case 10:
    iVar8 = 0;
    if (((iVar5 != 1) && (iVar8 = iVar5, iVar5 == 2)) && (iVar8 = 2, iVar3 < attsMax)) {
      atts[iVar3].normalized = '\0';
    }
    goto switchD_00630b8b_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_00630b8b_caseD_b;
  case 0xc:
    if (iVar5 != 2) {
      cVar7 = '\f';
LAB_00630dcb:
      iVar8 = 2;
      if (iVar3 < attsMax) {
        atts[iVar3].valuePtr = (char *)(pbVar6 + 4);
      }
      goto switchD_00630b8b_caseD_4;
    }
    iVar8 = 2;
    if (cVar7 != '\f') goto switchD_00630b8b_caseD_4;
    if (iVar3 < attsMax) {
      atts[iVar3].valueEnd = (char *)pbVar1;
    }
    cVar7 = '\f';
    break;
  case 0xd:
    if (iVar5 != 2) {
      cVar7 = '\r';
      goto LAB_00630dcb;
    }
    iVar8 = 2;
    if (cVar7 != '\r') goto switchD_00630b8b_caseD_4;
    if (iVar3 < attsMax) {
      atts[iVar3].valueEnd = (char *)pbVar1;
    }
    cVar7 = '\r';
    break;
  case 0x15:
    iVar8 = 0;
    if ((((iVar5 != 1) && (iVar8 = iVar5, iVar5 == 2)) && (iVar8 = 2, iVar3 < attsMax)) &&
       (atts[iVar3].normalized != '\0')) {
      if ((pbVar1 != (byte *)atts[iVar3].valuePtr) && (*pbVar1 == 0x20)) {
        bVar2 = pbVar6[5];
        if (bVar2 < 0xdc) {
          cVar4 = '\a';
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              if ((ulong)pbVar6[4] == 0x20) goto LAB_00630e27;
              cVar4 = *(char *)((long)enc[1].scanners + (ulong)pbVar6[4]);
            }
            else {
LAB_00630e16:
              cVar4 = '\x1d';
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          cVar4 = '\b';
        }
        else if ((bVar2 != 0xff) || (cVar4 = '\0', pbVar6[4] < 0xfe)) goto LAB_00630e16;
        if (cVar4 != cVar7) goto switchD_00630b8b_caseD_4;
      }
LAB_00630e27:
      atts[iVar3].normalized = '\0';
    }
    goto switchD_00630b8b_caseD_4;
  }
  iVar3 = iVar3 + 1;
  iVar8 = 0;
  goto switchD_00630b8b_caseD_4;
switchD_00630b8b_caseD_b:
  iVar8 = 2;
  if (iVar5 != 2) {
    return iVar3;
  }
  goto switchD_00630b8b_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr, int attsMax,
                ATTRIBUTE *atts) {
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define START_NAME                                                           \
    if (state == other) {                                                      \
      if (nAtts < attsMax) {                                                   \
        atts[nAtts].name = ptr;                                                \
        atts[nAtts].normalized = 1;                                            \
      }                                                                        \
      state = inName;                                                          \
    }
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n: /* NOTE: The encoding has already been validated. */        \
    START_NAME ptr += (n - MINBPC(enc));                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#  undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      } else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      } else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR:
    case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}